

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void addLocal(Token name)

{
  int iVar1;
  Compiler *pCVar2;
  Local *pLVar3;
  undefined8 in_stack_00000008;
  Local *local;
  undefined4 uStack0000000000000018;
  undefined4 uStack000000000000001c;
  
  pCVar2 = current;
  if (current->localCount == 0x100) {
    error((char *)0x10743d);
  }
  else {
    iVar1 = current->localCount;
    current->localCount = iVar1 + 1;
    pLVar3 = pCVar2->locals + iVar1;
    *(undefined8 *)&pLVar3->name = in_stack_00000008;
    (pLVar3->name).start = (char *)local;
    (pLVar3->name).length = uStack0000000000000018;
    (pLVar3->name).line = uStack000000000000001c;
    pLVar3->depth = -1;
    pLVar3->isCaptured = false;
  }
  return;
}

Assistant:

static void addLocal(Token name) {
    if (current->localCount == UINT8_COUNT) {
        error("Too many local variables in function.");
        return;
    }
    Local *local = &current->locals[current->localCount++];
    local->name = name;
    local->depth = -1;
    local->isCaptured = false;
}